

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O0

ColorScheme __thiscall QKdeThemePrivate::colorSchemeFromPalette(QKdeThemePrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadeb63);
  if (bVar1) {
    std::unique_ptr<QPalette,_std::default_delete<QPalette>_>::operator->
              ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadeb85);
    QPalette::text((QPalette *)0xadeb8d);
    QBrush::color((QBrush *)0xadeb95);
    iVar2 = QColor::lightness((QColor *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    std::unique_ptr<QPalette,_std::default_delete<QPalette>_>::operator->
              ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadebb2);
    QPalette::base((QPalette *)0xadebba);
    QBrush::color((QBrush *)0xadebc2);
    iVar3 = QColor::lightness((QColor *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    if (iVar2 < iVar3) {
      local_4 = Light;
    }
    else {
      std::unique_ptr<QPalette,_std::default_delete<QPalette>_>::operator->
                ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadebef);
      QPalette::text((QPalette *)0xadebf7);
      QBrush::color((QBrush *)0xadebff);
      iVar3 = QColor::lightness((QColor *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      std::unique_ptr<QPalette,_std::default_delete<QPalette>_>::operator->
                ((unique_ptr<QPalette,_std::default_delete<QPalette>_> *)0xadec1c);
      QPalette::base((QPalette *)0xadec24);
      QBrush::color((QBrush *)0xadec2c);
      iVar2 = QColor::lightness((QColor *)CONCAT44(iVar2,iVar3));
      if (iVar2 < iVar3) {
        local_4 = Dark;
      }
      else {
        local_4 = Unknown;
      }
    }
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

Qt::ColorScheme QKdeThemePrivate::colorSchemeFromPalette() const
{
    if (!systemPalette)
        return Qt::ColorScheme::Unknown;
    if (systemPalette->text().color().lightness() < systemPalette->base().color().lightness())
        return Qt::ColorScheme::Light;
    if (systemPalette->text().color().lightness() > systemPalette->base().color().lightness())
        return Qt::ColorScheme::Dark;
    return Qt::ColorScheme::Unknown;
}